

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::visit_typed_array(void *param_1,span<const_unsigned_short,_18446744073709551615UL> *param_2,
                   undefined1 param_3,undefined8 param_4,
                   basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                   *param_5)

{
  bool bVar1;
  size_type sVar2;
  uchar *__dest;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  error_code *peVar4;
  const_iterator p;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  ser_context *in_stack_ffffffffffffff48;
  error_code *ec;
  basic_json_visitor<char> *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  allocator_type *in_stack_ffffffffffffff60;
  byte_string_view *this;
  error_code *local_80;
  undefined1 local_51 [25];
  byte_string_view *in_stack_ffffffffffffffc8;
  
  bVar1 = cbor_encode_options::use_typed_arrays((cbor_encode_options *)((long)param_1 + 0x10));
  if (bVar1) {
    write_typed_array_tag
              ((basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                *)param_1,param_3);
    sVar2 = jsoncons::detail::span<const_unsigned_short,_18446744073709551615UL>::size(param_2);
    sVar2 = sVar2 * 2;
    pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_51;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2d7ea5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (pvVar3,sVar2,in_stack_ffffffffffffff60);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2d7ec5);
    this = (byte_string_view *)(local_51 + 1);
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2d7ed4);
    pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             jsoncons::detail::span<const_unsigned_short,_18446744073709551615UL>::data(param_2);
    sVar2 = jsoncons::detail::span<const_unsigned_short,_18446744073709551615UL>::size(param_2);
    memcpy(__dest,pvVar3,sVar2 * 2);
    byte_string_view::byte_string_view<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (this,pvVar3,(type_conflict)((ulong)__dest >> 0x20));
    write_byte_string(param_5,in_stack_ffffffffffffffc8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  else {
    jsoncons::detail::span<const_unsigned_short,_18446744073709551615UL>::size(param_2);
    basic_json_visitor<char>::begin_array
              ((basic_json_visitor<char> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (semantic_tag)((ulong)in_stack_ffffffffffffff50 >> 0x38),in_stack_ffffffffffffff48,
               (error_code *)0x2d7fae);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)param_5);
    if (!bVar1) {
      local_80 = (error_code *)
                 jsoncons::detail::span<const_unsigned_short,_18446744073709551615UL>::begin
                           (param_2);
      while (ec = local_80,
            peVar4 = (error_code *)
                     jsoncons::detail::span<const_unsigned_short,_18446744073709551615UL>::end
                               (param_2), ec != peVar4) {
        basic_json_visitor<char>::half_value
                  ((basic_json_visitor<char> *)in_stack_ffffffffffffff60,
                   (uint16_t)(in_stack_ffffffffffffff58 >> 0x30),
                   (semantic_tag)(in_stack_ffffffffffffff58 >> 0x28),
                   (ser_context *)in_stack_ffffffffffffff50,ec);
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)param_5);
        if (bVar1) {
          return true;
        }
        local_80 = (error_code *)((long)&local_80->_M_value + 2);
      }
      basic_json_visitor<char>::end_array
                (in_stack_ffffffffffffff50,(ser_context *)ec,(error_code *)0x2d8085);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(half_arg_t, const jsoncons::span<const uint16_t>& data,  
        semantic_tag tag,
        const ser_context& context, 
        std::error_code& ec) override
    {
        if (options_.use_typed_arrays())
        {
            write_typed_array_tag(std::integral_constant<bool, jsoncons::endian::native == jsoncons::endian::big>(), 
                                  half_arg, 
                                  tag);
            std::vector<uint8_t> v(data.size()*sizeof(uint16_t));
            std::memcpy(v.data(),data.data(),data.size()*sizeof(uint16_t));
            write_byte_string(byte_string_view(v));
            JSONCONS_VISITOR_RETURN;
        }
        else
        {
            this->begin_array(data.size(), semantic_tag::none, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            for (auto p = data.begin(); p != data.end(); ++p)
            {
                this->half_value(*p, tag, context, ec);
                if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            }
            this->end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }
    }